

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O0

bool __thiscall
QGraphicsAnchorLayoutPrivate::calculateNonTrunk
          (QGraphicsAnchorLayoutPrivate *this,QList<QSimplexConstraint_*> *constraints,
          QList<QtGraphicsAnchorLayout::AnchorData_*> *variables)

{
  AnchorData *pAVar1;
  bool bVar2;
  long i;
  qsizetype qVar3;
  const_reference ppAVar4;
  QList<QtGraphicsAnchorLayout::AnchorData_*> *in_RDX;
  QList<QtGraphicsAnchorLayout::AnchorData_*> *in_RDI;
  qreal in_stack_00000008;
  AnchorData *ad;
  int j;
  bool feasible;
  QList<QtGraphicsAnchorLayout::AnchorData_*> *in_stack_000000e0;
  QList<QSimplexConstraint_*> *in_stack_000000e8;
  QGraphicsAnchorLayoutPrivate *in_stack_000000f0;
  int local_20;
  
  shiftConstraints((QList<QSimplexConstraint_*> *)ad,in_stack_00000008);
  bVar2 = solvePreferred(in_stack_000000f0,in_stack_000000e8,in_stack_000000e0);
  if (bVar2) {
    local_20 = 0;
    while( true ) {
      i = (long)local_20;
      qVar3 = QList<QtGraphicsAnchorLayout::AnchorData_*>::size(in_RDX);
      if (qVar3 <= i) break;
      ppAVar4 = QList<QtGraphicsAnchorLayout::AnchorData_*>::at(in_RDI,i);
      pAVar1 = *ppAVar4;
      pAVar1->sizeAtMinimum = pAVar1->sizeAtPreferred;
      pAVar1->sizeAtMaximum = pAVar1->sizeAtPreferred;
      local_20 = local_20 + 1;
    }
  }
  shiftConstraints((QList<QSimplexConstraint_*> *)ad,in_stack_00000008);
  return bVar2;
}

Assistant:

bool QGraphicsAnchorLayoutPrivate::calculateNonTrunk(const QList<QSimplexConstraint *> &constraints,
                                                     const QList<AnchorData *> &variables)
{
    shiftConstraints(constraints, g_offset);
    bool feasible = solvePreferred(constraints, variables);

    if (feasible) {
        // Propagate size at preferred to other sizes. Semi-floats always will be
        // in their sizeAtPreferred.
        for (int j = 0; j < variables.size(); ++j) {
            AnchorData *ad = variables.at(j);
            Q_ASSERT(ad);
            ad->sizeAtMinimum = ad->sizeAtPreferred;
            ad->sizeAtMaximum = ad->sizeAtPreferred;
        }
    }

    shiftConstraints(constraints, -g_offset);
    return feasible;
}